

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

double __thiscall r_exec::exp(r_exec *this,double __x)

{
  double dVar1;
  char cVar2;
  uint16_t uVar3;
  long *plVar4;
  long *plVar5;
  uint16_t *in_RSI;
  Atom *a;
  float fVar6;
  Atom local_30 [4];
  Atom local_2c [4];
  
  plVar4 = (long *)(**(code **)(**(long **)(this + 8) + 0x38))(SUB84(__x,0),*(long **)(this + 8),1);
  plVar5 = (long *)(**(code **)(*plVar4 + 0x40))(plVar4);
  (**(code **)(*plVar4 + 8))(plVar4);
  (**(code **)(*plVar5 + 0x20))(plVar5,0);
  cVar2 = r_code::Atom::isFloat();
  if (cVar2 == '\0') {
    a = local_30;
    r_code::Atom::Nil();
    uVar3 = Context::setAtomicResult((Context *)this,a);
  }
  else {
    (**(code **)(*plVar5 + 0x20))(plVar5,0);
    fVar6 = (float)r_code::Atom::asFloat();
    fVar6 = expf(fVar6);
    a = local_2c;
    r_code::Atom::Float(fVar6);
    uVar3 = Context::setAtomicResult((Context *)this,a);
  }
  *in_RSI = uVar3;
  r_code::Atom::~Atom(a);
  dVar1 = (double)(**(code **)(*plVar5 + 8))(plVar5);
  return dVar1;
}

Assistant:

bool exp(const Context &context, uint16_t &index)
{
    Context arg = *context.getChild(1);

    if (arg[0].isFloat()) {
        index = context.setAtomicResult(Atom::Float(::exp(arg[0].asFloat())));
        return true;
    }

    index = context.setAtomicResult(Atom::Nil());
    return false;
}